

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

size_t pack_fail(char **buf,FailMsg *fmsg)

{
  size_t local_30;
  size_t len;
  char *ptr;
  FailMsg *fmsg_local;
  char **buf_local;
  
  ptr = (char *)fmsg;
  fmsg_local = (FailMsg *)buf;
  if (fmsg->msg == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = strlen(fmsg->msg);
  }
  len = (size_t)emalloc(local_30 + 8);
  fmsg_local->msg = (char *)len;
  pack_type((char **)&len,CK_MSG_FAIL);
  pack_str((char **)&len,*(char **)ptr);
  return local_30 + 8;
}

Assistant:

static size_t pack_fail(char **buf, FailMsg * fmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4 + (fmsg->msg ? strlen(fmsg->msg) : 0);
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_FAIL);
    pack_str(&ptr, fmsg->msg);

    return len;
}